

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetDirFromEnv_abi_cxx11_
                   (initializer_list<const_char_*> environment_variables,char *fallback,
                   char separator)

{
  char *pcVar1;
  char *__s;
  size_t sVar2;
  string *psVar3;
  char *in_RCX;
  string *in_RDI;
  char in_R8B;
  char *value;
  char *variable_name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> *in_stack_ffffffffffffff30;
  allocator *paVar4;
  allocator local_86;
  allocator local_85 [20];
  allocator local_71;
  string local_70 [32];
  char *local_50;
  char *local_48;
  const_iterator local_40;
  const_iterator local_38;
  initializer_list<const_char_*> *local_30;
  char local_21;
  char *local_20;
  initializer_list<const_char_*> local_18;
  
  local_30 = &local_18;
  local_21 = in_R8B;
  local_20 = in_RCX;
  local_38 = std::initializer_list<const_char_*>::begin(local_30);
  local_40 = std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff30);
  while( true ) {
    if (local_38 == local_40) {
      paVar4 = &local_86;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,local_20,paVar4);
      std::allocator<char>::~allocator((allocator<char> *)&local_86);
      return in_RDI;
    }
    local_48 = *local_38;
    __s = internal::posix::GetEnv((char *)0x13d8ee);
    local_50 = __s;
    if ((__s != (char *)0x0) && (*__s != '\0')) break;
    local_38 = local_38 + 1;
  }
  sVar2 = strlen(__s);
  pcVar1 = local_50;
  if (__s[sVar2 - 1] != local_21) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    psVar3 = (string *)std::__cxx11::string::append((ulong)local_70,'\x01');
    std::__cxx11::string::string((string *)in_RDI,psVar3);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    return in_RDI;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,local_85);
  std::allocator<char>::~allocator((allocator<char> *)local_85);
  return in_RDI;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}